

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupSpreadFlop(Gia_Man_t *p,Vec_Int_t *vFfMask)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_30;
  int Entry;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vFfMask_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vFfMask);
  iVar2 = Gia_ManRegNum(p);
  if (iVar1 < iVar2) {
    __assert_fail("Vec_IntSize(vFfMask) >= Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x379,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  Entry = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (Entry < iVar1) {
      _k = Gia_ManCi(p,Entry);
      bVar6 = _k != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar3 = Gia_ManAppendCi(p_00);
    _k->Value = uVar3;
    Entry = Entry + 1;
  }
  local_30 = 0;
  for (Entry = 0; iVar1 = Vec_IntSize(vFfMask), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(vFfMask,Entry);
    if (iVar1 == -1) {
      Gia_ManAppendCi(p_00);
    }
    else {
      uVar3 = Gia_ManAppendCi(p_00);
      pGVar5 = Gia_ManRo(p,local_30);
      pGVar5->Value = uVar3;
      local_30 = local_30 + 1;
    }
  }
  iVar1 = Gia_ManRegNum(p);
  if (local_30 == iVar1) {
    Entry = 0;
    while( true ) {
      bVar6 = false;
      if (Entry < p->nObjs) {
        _k = Gia_ManObj(p,Entry);
        bVar6 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjIsAnd(_k);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(_k);
        iVar2 = Gia_ObjFanin1Copy(_k);
        uVar3 = Gia_ManAppendAnd(p_00,iVar1,iVar2);
        _k->Value = uVar3;
      }
      Entry = Entry + 1;
    }
    Entry = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar6 = false;
      if (Entry < iVar1) {
        _k = Gia_ManCo(p,Entry);
        bVar6 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjFanin0Copy(_k);
      uVar3 = Gia_ManAppendCo(p_00,iVar1);
      _k->Value = uVar3;
      Entry = Entry + 1;
    }
    local_30 = 0;
    for (Entry = 0; iVar1 = Vec_IntSize(vFfMask), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(vFfMask,Entry);
      if (iVar1 == -1) {
        Gia_ManAppendCo(p_00,0);
      }
      else {
        pGVar5 = Gia_ManRi(p,local_30);
        iVar1 = Gia_ObjFanin0Copy(pGVar5);
        uVar3 = Gia_ManAppendCo(p_00,iVar1);
        pGVar5->Value = uVar3;
        local_30 = local_30 + 1;
      }
    }
    iVar1 = Gia_ManRegNum(p);
    if (local_30 == iVar1) {
      iVar1 = Vec_IntSize(vFfMask);
      Gia_ManSetRegNum(p_00,iVar1);
      return p_00;
    }
    __assert_fail("k == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x394,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  __assert_fail("k == Gia_ManRegNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x386,"Gia_Man_t *Gia_ManDupSpreadFlop(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupSpreadFlop( Gia_Man_t * p, Vec_Int_t * vFfMask )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, k, Entry;
    assert( Vec_IntSize(vFfMask) >= Gia_ManRegNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    k = 0;
    Vec_IntForEachEntry( vFfMask, Entry, i )
        if ( Entry == -1 )
            Gia_ManAppendCi(pNew);
        else
            Gia_ManRo(p, k++)->Value = Gia_ManAppendCi(pNew);
    assert( k == Gia_ManRegNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    k = 0;
    Vec_IntForEachEntry( vFfMask, Entry, i )
        if ( Entry == -1 )
            Gia_ManAppendCo( pNew, 0 );
        else
        {
            pObj = Gia_ManRi( p, k++ );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
    assert( k == Gia_ManRegNum(p) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vFfMask) );
    return pNew;
}